

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall ki::dml::Field<unsigned_short>::~Field(Field<unsigned_short> *this)

{
  Field<unsigned_short> *this_local;
  
  ~Field(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~Field() = default;